

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O3

void redistribute_nd(int *dim,int *pdim,int ndim,int *pidx,int size,int *embed,cpx_t *work,
                    cpx_t *scratch,int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,
                    int *dfft_offset_recv,int c2b,MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  cpx_t *work_00;
  ulong uVar4;
  cpx_t *scratch_00;
  cpx_t *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (0 < ndim) {
    uVar8 = 0;
    pcVar5 = work;
    scratch_00 = scratch;
    do {
      work_00 = pcVar5;
      if (c2b == 0) {
        dfft_redistribute_block_to_cyclic_1d
                  (dim,pdim,ndim,(int)uVar8,1,pdim[uVar8],pidx,size,embed,work_00,scratch_00,
                   dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,comm,proc_map,row_m);
      }
      else {
        dfft_redistribute_cyclic_to_block_1d
                  (dim,pdim,ndim,(int)uVar8,pdim[uVar8],1,pidx,0,size,embed,work_00,scratch_00,
                   (int *)0x0,(int *)0x0,dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,
                   comm,proc_map,row_m);
      }
      iVar1 = dim[uVar8];
      iVar2 = pdim[uVar8];
      if (0 < (int)((long)iVar1 / (long)iVar2)) {
        iVar3 = embed[uVar8];
        uVar4 = (long)size / (long)iVar3 & 0xffffffff;
        uVar6 = 0;
        pcVar5 = work_00;
        do {
          if (0 < (int)((long)size / (long)iVar3)) {
            uVar7 = 0;
            do {
              scratch_00[embed[uVar8] * (int)uVar7 + (int)uVar6] = pcVar5[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
          uVar6 = uVar6 + 1;
          pcVar5 = pcVar5 + uVar4;
        } while (uVar6 != ((long)iVar1 / (long)iVar2 & 0xffffffffU));
      }
      uVar8 = uVar8 + 1;
      pcVar5 = scratch_00;
      scratch_00 = work_00;
    } while (uVar8 != (uint)ndim);
  }
  if ((ndim & 1U) == 0) {
    return;
  }
  memcpy(work,scratch,(long)size << 3);
  return;
}

Assistant:

void redistribute_nd(int *dim,
            int *pdim,
            int ndim,
            int* pidx,
            int size,
            int *embed,
            cpx_t *work,
            cpx_t *scratch,
            int *dfft_nsend,
            int *dfft_nrecv,
            int *dfft_offset_send,
            int *dfft_offset_recv,
            int c2b,
            MPI_Comm comm,
            int *proc_map,
            int row_m)
    {
    cpx_t *cur_work =work;
    cpx_t *cur_scratch =scratch;

    int current_dim;
    for (current_dim = 0; current_dim < ndim; ++current_dim)
        {
        /* redistribute along one dimension (in-place) */
        if (!c2b)
            dfft_redistribute_block_to_cyclic_1d(dim, pdim, ndim, current_dim,
                1, pdim[current_dim], pidx, size, embed,
                cur_work, cur_scratch, dfft_nsend,dfft_nrecv,
                dfft_offset_send, dfft_offset_recv, comm, proc_map, row_m);
        else
            dfft_redistribute_cyclic_to_block_1d(dim, pdim, ndim, current_dim,
                pdim[current_dim], 1, pidx, 0, size, embed, cur_work,
                cur_scratch, NULL, NULL, dfft_nsend,
                dfft_nrecv, dfft_offset_send, dfft_offset_recv, comm, proc_map, row_m);

        int l = dim[current_dim]/pdim[current_dim];
        int stride = size/embed[current_dim];

        /* transpose local matrix from column major to row major */
        int i;
        #pragma omp parallel for private(i)
        for (i = 0; i < l; ++i)
            {
            int j;
            for (j = 0; j < stride; ++j)
                {
                int gidx = j+i*stride;
                int new_idx = j*embed[current_dim]+i;
                cur_scratch[new_idx] =cur_work[gidx];
                }
            }

        /* swap buffers */
        cpx_t *tmp;
        tmp = cur_scratch;
        cur_scratch = cur_work;
        cur_work = tmp;
        }

    if (ndim % 2)
        {
        memcpy(work, scratch, sizeof(cpx_t)*size);
        }
    }